

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int dleq_verify(PMBTOKEN_METHOD *method,CBS *cbs,TRUST_TOKEN_CLIENT_KEY *pub,EC_JACOBIAN *T,
               EC_JACOBIAN *S,EC_JACOBIAN *W,EC_JACOBIAN *Ws)

{
  EC_GROUP *group_00;
  int iVar1;
  EC_JACOBIAN *p0;
  undefined1 local_14f8 [8];
  EC_SCALAR c;
  EC_SCALAR calculated;
  EC_AFFINE affines [10];
  undefined1 local_ec0 [8];
  EC_SCALAR minus_c1;
  EC_SCALAR minus_c0;
  EC_JACOBIAN pub1;
  EC_JACOBIAN pub0;
  EC_SCALAR v1;
  EC_SCALAR v0;
  EC_SCALAR u1;
  EC_SCALAR u0;
  EC_SCALAR c1;
  EC_SCALAR c0;
  EC_SCALAR minus_cs;
  EC_JACOBIAN pubs;
  EC_SCALAR vs;
  EC_SCALAR us;
  EC_SCALAR cs;
  EC_JACOBIAN jacobians [10];
  EC_JACOBIAN *g;
  EC_GROUP *group;
  EC_JACOBIAN *W_local;
  EC_JACOBIAN *S_local;
  EC_JACOBIAN *T_local;
  TRUST_TOKEN_CLIENT_KEY *pub_local;
  CBS *cbs_local;
  PMBTOKEN_METHOD *method_local;
  
  group_00 = method->group;
  p0 = &(group_00->generator).raw;
  iVar1 = scalar_from_cbs(cbs,group_00,(EC_SCALAR *)(us.words + 8));
  if (((iVar1 == 0) ||
      (iVar1 = scalar_from_cbs(cbs,group_00,(EC_SCALAR *)(vs.words + 8)), iVar1 == 0)) ||
     (iVar1 = scalar_from_cbs(cbs,group_00,(EC_SCALAR *)(pubs.Z.words + 8)), iVar1 == 0)) {
    ERR_put_error(0x20,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                  ,0x2ba);
    return 0;
  }
  ec_affine_to_jacobian(group_00,(EC_JACOBIAN *)(minus_cs.words + 8),&pub->pubs);
  ec_scalar_neg(group_00,(EC_SCALAR *)(c0.words + 8),(EC_SCALAR *)(us.words + 8));
  iVar1 = mul_public_3(group_00,(EC_JACOBIAN *)(jacobians[3].Z.words + 8),p0,
                       (EC_SCALAR *)(vs.words + 8),&method->h,(EC_SCALAR *)(pubs.Z.words + 8),
                       (EC_JACOBIAN *)(minus_cs.words + 8),(EC_SCALAR *)(c0.words + 8));
  if ((iVar1 == 0) ||
     (iVar1 = mul_public_3(group_00,(EC_JACOBIAN *)(jacobians[4].Z.words + 8),T,
                           (EC_SCALAR *)(vs.words + 8),S,(EC_SCALAR *)(pubs.Z.words + 8),Ws,
                           (EC_SCALAR *)(c0.words + 8)), iVar1 == 0)) {
    return 0;
  }
  iVar1 = scalar_from_cbs(cbs,group_00,(EC_SCALAR *)(c1.words + 8));
  if ((((iVar1 == 0) ||
       ((iVar1 = scalar_from_cbs(cbs,group_00,(EC_SCALAR *)(u0.words + 8)), iVar1 == 0 ||
        (iVar1 = scalar_from_cbs(cbs,group_00,(EC_SCALAR *)(u1.words + 8)), iVar1 == 0)))) ||
      (iVar1 = scalar_from_cbs(cbs,group_00,(EC_SCALAR *)(v0.words + 8)), iVar1 == 0)) ||
     ((iVar1 = scalar_from_cbs(cbs,group_00,(EC_SCALAR *)(v1.words + 8)), iVar1 == 0 ||
      (iVar1 = scalar_from_cbs(cbs,group_00,(EC_SCALAR *)(pub0.Z.words + 8)), iVar1 == 0)))) {
    ERR_put_error(0x20,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                  ,0x2cf);
    return 0;
  }
  ec_affine_to_jacobian(group_00,(EC_JACOBIAN *)(pub1.Z.words + 8),&pub->pub0);
  ec_affine_to_jacobian(group_00,(EC_JACOBIAN *)(minus_c0.words + 8),&pub->pub1);
  ec_scalar_neg(group_00,(EC_SCALAR *)(minus_c1.words + 8),(EC_SCALAR *)(c1.words + 8));
  ec_scalar_neg(group_00,(EC_SCALAR *)local_ec0,(EC_SCALAR *)(u0.words + 8));
  iVar1 = mul_public_3(group_00,(EC_JACOBIAN *)(jacobians[5].Z.words + 8),p0,
                       (EC_SCALAR *)(u1.words + 8),&method->h,(EC_SCALAR *)(v1.words + 8),
                       (EC_JACOBIAN *)(pub1.Z.words + 8),(EC_SCALAR *)(minus_c1.words + 8));
  if ((iVar1 == 0) ||
     (((iVar1 = mul_public_3(group_00,(EC_JACOBIAN *)(jacobians[6].Z.words + 8),T,
                             (EC_SCALAR *)(u1.words + 8),S,(EC_SCALAR *)(v1.words + 8),W,
                             (EC_SCALAR *)(minus_c1.words + 8)), iVar1 == 0 ||
       (iVar1 = mul_public_3(group_00,(EC_JACOBIAN *)(jacobians[7].Z.words + 8),p0,
                             (EC_SCALAR *)(v0.words + 8),&method->h,(EC_SCALAR *)(pub0.Z.words + 8),
                             (EC_JACOBIAN *)(minus_c0.words + 8),(EC_SCALAR *)local_ec0), iVar1 == 0
       )) || (iVar1 = mul_public_3(group_00,(EC_JACOBIAN *)(jacobians[8].Z.words + 8),T,
                                   (EC_SCALAR *)(v0.words + 8),S,(EC_SCALAR *)(pub0.Z.words + 8),W,
                                   (EC_SCALAR *)local_ec0), iVar1 == 0)))) {
    return 0;
  }
  memcpy(cs.words + 8,T,0xd8);
  memcpy(jacobians[0].Z.words + 8,S,0xd8);
  memcpy(jacobians[1].Z.words + 8,W,0xd8);
  memcpy(jacobians[2].Z.words + 8,Ws,0xd8);
  iVar1 = ec_jacobian_to_affine_batch
                    (group_00,(EC_AFFINE *)(calculated.words + 8),(EC_JACOBIAN *)(cs.words + 8),10);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = hash_c_dleq(method,(EC_SCALAR *)(c.words + 8),&pub->pubs,
                      (EC_AFFINE *)(calculated.words + 8),(EC_AFFINE *)(affines[0].Y.words + 8),
                      (EC_AFFINE *)(affines[2].Y.words + 8),(EC_AFFINE *)(affines[3].Y.words + 8),
                      (EC_AFFINE *)(affines[4].Y.words + 8));
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = ec_scalar_equal_vartime(group_00,(EC_SCALAR *)(us.words + 8),(EC_SCALAR *)(c.words + 8));
  if (iVar1 == 0) {
    ERR_put_error(0x20,0,0x72,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                  ,0x2f7);
    return 0;
  }
  iVar1 = hash_c_dleqor(method,(EC_SCALAR *)(c.words + 8),&pub->pub0,&pub->pub1,
                        (EC_AFFINE *)(calculated.words + 8),(EC_AFFINE *)(affines[0].Y.words + 8),
                        (EC_AFFINE *)(affines[1].Y.words + 8),(EC_AFFINE *)(affines[5].Y.words + 8),
                        (EC_AFFINE *)(affines[6].Y.words + 8),(EC_AFFINE *)(affines[7].Y.words + 8),
                        (EC_AFFINE *)(affines[8].Y.words + 8));
  if (iVar1 == 0) {
    return 0;
  }
  ec_scalar_add(group_00,(EC_SCALAR *)local_14f8,(EC_SCALAR *)(c1.words + 8),
                (EC_SCALAR *)(u0.words + 8));
  iVar1 = ec_scalar_equal_vartime(group_00,(EC_SCALAR *)local_14f8,(EC_SCALAR *)(c.words + 8));
  if (iVar1 == 0) {
    ERR_put_error(0x20,0,0x72,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                  ,0x307);
    return 0;
  }
  return 1;
}

Assistant:

static int dleq_verify(const PMBTOKEN_METHOD *method, CBS *cbs,
                       const TRUST_TOKEN_CLIENT_KEY *pub, const EC_JACOBIAN *T,
                       const EC_JACOBIAN *S, const EC_JACOBIAN *W,
                       const EC_JACOBIAN *Ws) {
  const EC_GROUP *group = method->group;
  const EC_JACOBIAN *g = &group->generator.raw;

  // We verify a DLEQ proof for the validity token and a DLEQOR2 proof for the
  // private metadata token. To allow amortizing Jacobian-to-affine conversions,
  // we compute Ki for both proofs first. Additionally, all inputs to this
  // function are public, so we can use the faster variable-time
  // multiplications.
  enum {
    idx_T,
    idx_S,
    idx_W,
    idx_Ws,
    idx_Ks0,
    idx_Ks1,
    idx_K00,
    idx_K01,
    idx_K10,
    idx_K11,
    num_idx,
  };
  EC_JACOBIAN jacobians[num_idx];

  // Decode the DLEQ proof.
  EC_SCALAR cs, us, vs;
  if (!scalar_from_cbs(cbs, group, &cs) || !scalar_from_cbs(cbs, group, &us) ||
      !scalar_from_cbs(cbs, group, &vs)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  // Ks = us*(G;T) + vs*(H;S) - cs*(pubs;Ws)
  EC_JACOBIAN pubs;
  ec_affine_to_jacobian(group, &pubs, &pub->pubs);
  EC_SCALAR minus_cs;
  ec_scalar_neg(group, &minus_cs, &cs);
  if (!mul_public_3(group, &jacobians[idx_Ks0], g, &us, &method->h, &vs, &pubs,
                    &minus_cs) ||
      !mul_public_3(group, &jacobians[idx_Ks1], T, &us, S, &vs, Ws,
                    &minus_cs)) {
    return 0;
  }

  // Decode the DLEQOR proof.
  EC_SCALAR c0, c1, u0, u1, v0, v1;
  if (!scalar_from_cbs(cbs, group, &c0) || !scalar_from_cbs(cbs, group, &c1) ||
      !scalar_from_cbs(cbs, group, &u0) || !scalar_from_cbs(cbs, group, &u1) ||
      !scalar_from_cbs(cbs, group, &v0) || !scalar_from_cbs(cbs, group, &v1)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  EC_JACOBIAN pub0, pub1;
  ec_affine_to_jacobian(group, &pub0, &pub->pub0);
  ec_affine_to_jacobian(group, &pub1, &pub->pub1);
  EC_SCALAR minus_c0, minus_c1;
  ec_scalar_neg(group, &minus_c0, &c0);
  ec_scalar_neg(group, &minus_c1, &c1);
  if (  // K0 = u0*(G;T) + v0*(H;S) - c0*(pub0;W)
      !mul_public_3(group, &jacobians[idx_K00], g, &u0, &method->h, &v0, &pub0,
                    &minus_c0) ||
      !mul_public_3(group, &jacobians[idx_K01], T, &u0, S, &v0, W, &minus_c0) ||
      // K1 = u1*(G;T) + v1*(H;S) - c1*(pub1;W)
      !mul_public_3(group, &jacobians[idx_K10], g, &u1, &method->h, &v1, &pub1,
                    &minus_c1) ||
      !mul_public_3(group, &jacobians[idx_K11], T, &u1, S, &v1, W, &minus_c1)) {
    return 0;
  }

  EC_AFFINE affines[num_idx];
  jacobians[idx_T] = *T;
  jacobians[idx_S] = *S;
  jacobians[idx_W] = *W;
  jacobians[idx_Ws] = *Ws;
  if (!ec_jacobian_to_affine_batch(group, affines, jacobians, num_idx)) {
    return 0;
  }

  // Check the DLEQ proof.
  EC_SCALAR calculated;
  if (!hash_c_dleq(method, &calculated, &pub->pubs, &affines[idx_T],
                   &affines[idx_S], &affines[idx_Ws], &affines[idx_Ks0],
                   &affines[idx_Ks1])) {
    return 0;
  }

  // cs == calculated
  if (!ec_scalar_equal_vartime(group, &cs, &calculated)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_INVALID_PROOF);
    return 0;
  }

  // Check the DLEQOR proof.
  if (!hash_c_dleqor(method, &calculated, &pub->pub0, &pub->pub1,
                     &affines[idx_T], &affines[idx_S], &affines[idx_W],
                     &affines[idx_K00], &affines[idx_K01], &affines[idx_K10],
                     &affines[idx_K11])) {
    return 0;
  }

  // c0 + c1 == calculated
  EC_SCALAR c;
  ec_scalar_add(group, &c, &c0, &c1);
  if (!ec_scalar_equal_vartime(group, &c, &calculated)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_INVALID_PROOF);
    return 0;
  }

  return 1;
}